

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

void __thiscall QSimplex::clearColumns(QSimplex *this,int first,int last)

{
  int iVar1;
  int iVar2;
  qreal *pqVar3;
  long lVar4;
  int j;
  long lVar5;
  
  iVar1 = this->rows;
  pqVar3 = this->matrix;
  iVar2 = this->columns;
  for (lVar4 = 0; lVar5 = (long)first, lVar4 < iVar1; lVar4 = lVar4 + 1) {
    for (; lVar5 <= last; lVar5 = lVar5 + 1) {
      pqVar3[lVar5] = 0.0;
    }
    pqVar3 = pqVar3 + iVar2;
  }
  return;
}

Assistant:

void QSimplex::clearColumns(int first, int last)
{
    for (int i = 0; i < rows; ++i) {
        qreal *row = matrix + i * columns;
        for (int j = first; j <= last; ++j)
            row[j] = 0.0;
    }
}